

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::TrackObjTypeSpecWriteGuards
          (BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  ObjTypeSpecFldInfo *this_00;
  Type pJVar1;
  Sym *pSVar2;
  BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  code *pcVar3;
  bool bVar4;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *pHVar5;
  StackSym *pSVar6;
  ObjWriteGuardBucket *pOVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  PropertyId local_3c;
  undefined4 *local_38;
  
  this_00 = opnd->objTypeSpecFldInfo;
  if (this->tag != BackwardPhase) {
    if ((((this_00 != (ObjTypeSpecFldInfo *)0x0) &&
         (bVar4 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_00), bVar4)) ||
        (((ushort)opnd->field_12 & 2) != 0)) &&
       (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) == 0)) {
      local_3c = IR::PropertySymOpnd::GetPropertyId(opnd);
      if ((this->func->anyPropertyMayBeWrittenTo == false) &&
         ((this_01 = &this->func->propertiesWrittenTo->
                      super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          , this_01 ==
            (BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)0x0 ||
          (bVar4 = JsUtil::
                   BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::ContainsKey(this_01,&local_3c), !bVar4)))) {
        IR::PropertySymOpnd::SetWriteGuardChecked(opnd,true);
      }
    }
    if ((this->currentPrePassLoop == (Loop *)0x0) &&
       (bVar4 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(opnd), !bVar4)) {
      opnd->writeGuards = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    return;
  }
  if (((this_00 != (ObjTypeSpecFldInfo *)0x0) &&
      (bVar4 = ObjTypeSpecFldInfo::IsMono(this_00), bVar4)) &&
     (((opnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0 &&
       (bVar4 = ObjTypeSpecFldInfo::IsLoadedFromProto(opnd->objTypeSpecFldInfo), bVar4)) ||
      (((ushort)opnd->field_12 & 2) != 0)))) {
    if (block->stackSymToWriteGuardsMap ==
        (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0) {
      pHVar5 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::New
                         (&this->tempAlloc->super_ArenaAllocator,8);
      block->stackSymToWriteGuardsMap = pHVar5;
    }
    pHVar5 = block->stackSymToWriteGuardsMap;
    pSVar6 = IR::PropertySymOpnd::GetObjectSym(opnd);
    pOVar7 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                       (pHVar5,(pSVar6->super_Sym).m_id);
    pBVar8 = pOVar7->writeGuards;
    if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
               new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3f1274);
      pJVar1 = this->tempAlloc;
      pBVar8->head = (Type_conflict)0x0;
      pBVar8->lastFoundIndex = (Type_conflict)0x0;
      pBVar8->alloc = pJVar1;
      pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
      pOVar7->writeGuards = pBVar8;
    }
    pSVar2 = (opnd->super_SymOpnd).m_sym;
    if (pSVar2->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_38 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar4) goto LAB_003ec1f8;
      *local_38 = 0;
    }
    if (pSVar2[2].m_next == (Sym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_38 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x165c,"(propertySym->m_writeGuardSym != nullptr)",
                         "propertySym->m_writeGuardSym != nullptr");
      if (!bVar4) goto LAB_003ec1f8;
      *local_38 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(pBVar8,(pSVar2[2].m_next)->m_id);
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return;
  }
  if (opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
    return;
  }
  bVar4 = ObjTypeSpecFldInfo::IsMono(opnd->objTypeSpecFldInfo);
  if (!bVar4) {
    return;
  }
  if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 4) != 0) {
    return;
  }
  if (opnd->writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1666,"(opnd->GetWriteGuards() == nullptr)",
                       "opnd->GetWriteGuards() == nullptr");
    if (!bVar4) {
LAB_003ec1f8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pHVar5 = block->stackSymToWriteGuardsMap;
  if (pHVar5 == (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0) {
    return;
  }
  pSVar6 = IR::PropertySymOpnd::GetObjectSym(opnd);
  pOVar7 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Get
                     (pHVar5,(pSVar6->super_Sym).m_id);
  if (pOVar7 == (ObjWriteGuardBucket *)0x0) {
    return;
  }
  pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pOVar7->writeGuards,this->func->m_alloc);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (pBVar8,block->upwardExposedFields);
  IR::PropertySymOpnd::SetWriteGuards(opnd,pBVar8);
  return;
}

Assistant:

void
BackwardPass::TrackObjTypeSpecWriteGuards(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    // TODO (ObjTypeSpec): Move write guard tracking to the forward pass, by recording on the type value
    // which property IDs have been written since the last type check. This will result in more accurate
    // tracking in cases when object pointer copy prop kicks in.
    if (this->tag == Js::BackwardPhase)
    {
        // If this operation may need a write guard (load from proto or fixed field check) then add its
        // write guard symbol to the map for this object. If it remains live (hasn't been written to)
        // until the type check upstream, it will get recorded there so that the type check can be registered
        // for invalidation on this property used in this operation.

        // (ObjTypeSpec): Consider supporting polymorphic write guards as well. We can't currently distinguish between mono and
        // poly write guards, and a type check can only protect operations matching with respect to polymorphism (see
        // BackwardPass::TrackObjTypeSpecProperties for details), so for now we only target monomorphic operations.
        if (opnd->IsMono() && opnd->MayNeedWriteGuardProtection())
        {
            if (block->stackSymToWriteGuardsMap == nullptr)
            {
                block->stackSymToWriteGuardsMap = HashTable<ObjWriteGuardBucket>::New(this->tempAlloc, 8);
            }

            ObjWriteGuardBucket* bucket = block->stackSymToWriteGuardsMap->FindOrInsertNew(opnd->GetObjectSym()->m_id);

            BVSparse<JitArenaAllocator>* writeGuards = bucket->GetWriteGuards();
            if (writeGuards == nullptr)
            {
                // The bit vectors we push around the flow graph only need to live as long as this phase.
                writeGuards = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                bucket->SetWriteGuards(writeGuards);
            }

            PropertySym *propertySym = opnd->m_sym->AsPropertySym();
            Assert(propertySym->m_writeGuardSym != nullptr);
            SymID writeGuardSymId = propertySym->m_writeGuardSym->m_id;
            writeGuards->Set(writeGuardSymId);
        }

        // Record any live (upward exposed) write guards on this operation, if this operation may end up with
        // a type check.  If we ultimately don't need a type check here, we will simply ignore the guards, because
        // an earlier type check will protect them.
        if (!IsPrePass() && opnd->IsMono() && !opnd->IsTypeDead())
        {
            Assert(opnd->GetWriteGuards() == nullptr);
            if (block->stackSymToWriteGuardsMap != nullptr)
            {
                ObjWriteGuardBucket* bucket = block->stackSymToWriteGuardsMap->Get(opnd->GetObjectSym()->m_id);
                if (bucket != nullptr)
                {
                    // Get all the write guards associated with this object sym and filter them down to those that
                    // are upward exposed. If we end up emitting a type check for this instruction, we will create
                    // a type property guard registered for all guarded proto properties and we will set the write
                    // guard syms live during forward pass, such that we can avoid unnecessary write guard type
                    // checks and bailouts on every proto property (as long as it hasn't been written to since the
                    // primary type check).
                    auto writeGuards = bucket->GetWriteGuards()->CopyNew(this->func->m_alloc);
                    writeGuards->And(block->upwardExposedFields);
                    opnd->SetWriteGuards(writeGuards);
                }
            }
        }
    }
    else
    {
        // If we know this property has never been written to in this function (either on this object or any
        // of its aliases) we don't need the local type check.
        if (opnd->MayNeedWriteGuardProtection() && !opnd->IsWriteGuardChecked() && !MayPropertyBeWrittenTo(opnd->GetPropertyId()))
        {
            opnd->SetWriteGuardChecked(true);
        }

        // If we don't need a primary type check here let's clear the write guards. The primary type check upstream will
        // register the type check for the corresponding properties.
        if (!IsPrePass() && !opnd->NeedsPrimaryTypeCheck())
        {
            opnd->ClearWriteGuards();
        }
    }
}